

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ec_commit(void)

{
  int iVar1;
  secp256k1_sha256 sha;
  uchar data [32];
  secp256k1_ge commitment;
  secp256k1_gej pubkeyj;
  secp256k1_ge pubkey;
  secp256k1_scalar seckey_s;
  secp256k1_scalar *in_stack_fffffffffffffe10;
  uchar *in_stack_fffffffffffffe18;
  secp256k1_sha256 *in_stack_fffffffffffffe20;
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_ge *in_stack_fffffffffffffe30;
  secp256k1_gej *in_stack_fffffffffffffe48;
  secp256k1_ge *in_stack_fffffffffffffe50;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_gej *in_stack_fffffffffffffed8;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  uchar *in_stack_fffffffffffffef0;
  secp256k1_sha256 *in_stack_fffffffffffffef8;
  secp256k1_ge *in_stack_ffffffffffffff00;
  secp256k1_ge *in_stack_ffffffffffffff08;
  secp256k1_scalar local_20;
  
  random_scalar_order_test(in_stack_fffffffffffffe10);
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  secp256k1_ge_set_gej(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  secp256k1_testrand256_test((uchar *)0x14a2af);
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdf0);
  iVar1 = secp256k1_ec_commit(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (size_t)in_stack_fffffffffffffe10);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x106a,
            "test condition failed: secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 32) == 1")
    ;
    abort();
  }
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdf0);
  iVar1 = secp256k1_ec_commit_verify
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x106c,
            "test condition failed: secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 32) == 1"
           );
    abort();
  }
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdf0);
  iVar1 = secp256k1_ec_commit_seckey
                    ((secp256k1_scalar *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (size_t)in_stack_fffffffffffffe10);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x106e,
            "test condition failed: secp256k1_ec_commit_seckey(&seckey_s, &pubkey, &sha, data, 32) == 1"
           );
    abort();
  }
  secp256k1_ecmult_gen
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  ge_equals_gej((secp256k1_ge *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdf0);
  iVar1 = secp256k1_ec_commit_verify
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1074,
            "test condition failed: secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 31) == 0"
           );
    abort();
  }
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffdf0);
  secp256k1_ge_set_infinity((secp256k1_ge *)0x14a4d7);
  iVar1 = secp256k1_ec_commit(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                              in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                              (size_t)in_stack_fffffffffffffe10);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x107a,
            "test condition failed: secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 32) == 0")
    ;
    abort();
  }
  secp256k1_scalar_set_int(&local_20,0);
  iVar1 = secp256k1_ec_commit_seckey
                    ((secp256k1_scalar *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (size_t)in_stack_fffffffffffffe10);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x107c,
            "test condition failed: secp256k1_ec_commit_seckey(&seckey_s, &pubkey, &sha, data, 32) == 0"
           );
    abort();
  }
  iVar1 = secp256k1_ec_commit_verify
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x107d,
            "test condition failed: secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 32) == 0"
           );
    abort();
  }
  return;
}

Assistant:

static void test_ec_commit(void) {
    secp256k1_scalar seckey_s;
    secp256k1_ge pubkey;
    secp256k1_gej pubkeyj;
    secp256k1_ge commitment;
    unsigned char data[32];
    secp256k1_sha256 sha;

    /* Create random keypair and data */
    random_scalar_order_test(&seckey_s);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pubkeyj, &seckey_s);
    secp256k1_ge_set_gej(&pubkey, &pubkeyj);
    secp256k1_testrand256_test(data);

    /* Commit to data and verify */
    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 32) == 1);
    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 32) == 1);
    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit_seckey(&seckey_s, &pubkey, &sha, data, 32) == 1);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pubkeyj, &seckey_s);
    ge_equals_gej(&commitment, &pubkeyj);

    /* Check that verification fails with different data */
    secp256k1_sha256_initialize(&sha);
    CHECK(secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 31) == 0);

    /* Check that commmitting fails when the inner pubkey is the point at
     * infinity */
    secp256k1_sha256_initialize(&sha);
    secp256k1_ge_set_infinity(&pubkey);
    CHECK(secp256k1_ec_commit(&commitment, &pubkey, &sha, data, 32) == 0);
    secp256k1_scalar_set_int(&seckey_s, 0);
    CHECK(secp256k1_ec_commit_seckey(&seckey_s, &pubkey, &sha, data, 32) == 0);
    CHECK(secp256k1_ec_commit_verify(&commitment, &pubkey, &sha, data, 32) == 0);
}